

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

string * __thiscall Tokens::current_abi_cxx11_(Tokens *this)

{
  pointer pbVar1;
  string *local_10;
  
  pbVar1 = (this->fTokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->fIndex <
      (ulong)((long)(this->fTokens).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    return pbVar1 + this->fIndex;
  }
  if (current[abi:cxx11]()::empty_abi_cxx11_ != '\0') {
    return &current[abi:cxx11]()::empty_abi_cxx11_;
  }
  current_abi_cxx11_();
  return local_10;
}

Assistant:

explicit operator bool() const {
		return fIndex < fTokens.size();
	}